

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O0

deBool deProcess_start(deProcess *process,char *commandLine,char *workingDirectory)

{
  int iVar1;
  __pid_t __pid;
  int *piVar2;
  deFile *pdVar3;
  int local_168;
  int local_164;
  int errPos;
  int procStatus;
  ssize_t result;
  char errBuf [256];
  int local_4c [2];
  int statusPipe [2];
  int pipeErr [2];
  int pipeOut [2];
  int pipeIn [2];
  pid_t pid;
  char *workingDirectory_local;
  char *commandLine_local;
  deProcess *process_local;
  
  pipeOut[0] = -1;
  pipeOut[1] = -1;
  pipeErr[0] = -1;
  pipeErr[1] = -1;
  statusPipe[0] = -1;
  statusPipe[1] = -1;
  local_4c[0] = -1;
  local_4c[1] = -1;
  if (process->state == PROCESSSTATE_RUNNING) {
    deProcess_setError(process,"Process already running");
    process_local._4_4_ = 0;
  }
  else {
    if (process->state == PROCESSSTATE_FINISHED) {
      deProcess_cleanupHandles(process);
      process->state = PROCESSSTATE_NOT_STARTED;
    }
    iVar1 = pipe(pipeOut);
    if ((((iVar1 < 0) || (iVar1 = pipe(pipeErr), iVar1 < 0)) ||
        (iVar1 = pipe(statusPipe), iVar1 < 0)) || (iVar1 = pipe(local_4c), iVar1 < 0)) {
      deProcess_setErrorFromErrno(process,"pipe() failed");
      closePipe(pipeOut);
      closePipe(pipeErr);
      closePipe(statusPipe);
      closePipe(local_4c);
      process_local._4_4_ = 0;
    }
    else {
      __pid = fork();
      if (__pid < 0) {
        deProcess_setErrorFromErrno(process,"fork() failed");
        closePipe(pipeOut);
        closePipe(pipeErr);
        closePipe(statusPipe);
        closePipe(local_4c);
        process_local._4_4_ = 0;
      }
      else {
        if (__pid == 0) {
          close(pipeOut[1]);
          close(pipeErr[0]);
          close(statusPipe[0]);
          close(local_4c[0]);
          iVar1 = fcntl(local_4c[1],2,1);
          if (iVar1 != 0) {
            dieLastError(local_4c[1],"Failed to set FD_CLOEXEC");
          }
          if ((pipeOut[0] != 0) && (iVar1 = dup2(pipeOut[0],0), iVar1 != 0)) {
            dieLastError(local_4c[1],"dup2() failed");
          }
          close(pipeOut[0]);
          if ((pipeErr[1] != 1) && (iVar1 = dup2(pipeErr[1],1), iVar1 != 1)) {
            dieLastError(local_4c[1],"dup2() failed");
          }
          close(pipeErr[1]);
          if ((statusPipe[1] != 2) && (iVar1 = dup2(statusPipe[1],2), iVar1 != 2)) {
            dieLastError(local_4c[1],"dup2() failed");
          }
          close(statusPipe[1]);
          execProcess(commandLine,workingDirectory,local_4c[1]);
        }
        else {
          _errPos = 0;
          close(local_4c[1]);
          do {
            _errPos = read(local_4c[0],&result,1);
            if (_errPos != -1) break;
            piVar2 = __errno_location();
          } while ((*piVar2 == 0xb) || (piVar2 = __errno_location(), *piVar2 == 4));
          if (0 < _errPos) {
            local_164 = 0;
            for (local_168 = 1; local_168 < 0x100; local_168 = local_168 + 1) {
              _errPos = read(local_4c[0],errBuf + (long)local_168 + -8,1);
              if (_errPos == -1) break;
            }
            errBuf[(long)local_168 + -8] = '\0';
            close(local_4c[0]);
            closePipe(pipeOut);
            closePipe(pipeErr);
            closePipe(statusPipe);
            waitpid(__pid,&local_164,0);
            deProcess_setError(process,(char *)&result);
            return 0;
          }
          close(local_4c[0]);
          process->pid = __pid;
          process->state = PROCESSSTATE_RUNNING;
          close(pipeOut[0]);
          close(pipeErr[1]);
          close(statusPipe[1]);
          pdVar3 = deFile_createFromHandle((long)pipeOut[1]);
          process->standardIn = pdVar3;
          pdVar3 = deFile_createFromHandle((long)pipeErr[0]);
          process->standardOut = pdVar3;
          pdVar3 = deFile_createFromHandle((long)statusPipe[0]);
          process->standardErr = pdVar3;
          if (process->standardIn == (deFile *)0x0) {
            close(pipeOut[1]);
          }
          if (process->standardOut == (deFile *)0x0) {
            close(pipeErr[0]);
          }
          if (process->standardErr == (deFile *)0x0) {
            close(statusPipe[0]);
          }
        }
        process_local._4_4_ = 1;
      }
    }
  }
  return process_local._4_4_;
}

Assistant:

deBool deProcess_start (deProcess* process, const char* commandLine, const char* workingDirectory)
{
	pid_t		pid				= 0;
	int			pipeIn[2]		= { -1, -1 };
	int			pipeOut[2]		= { -1, -1 };
	int			pipeErr[2]		= { -1, -1 };
	int			statusPipe[2]	= { -1, -1 };

	if (process->state == PROCESSSTATE_RUNNING)
	{
		deProcess_setError(process, "Process already running");
		return DE_FALSE;
	}
	else if (process->state == PROCESSSTATE_FINISHED)
	{
		deProcess_cleanupHandles(process);
		process->state = PROCESSSTATE_NOT_STARTED;
	}

	if (pipe(pipeIn) < 0 || pipe(pipeOut) < 0 || pipe(pipeErr) < 0 || pipe(statusPipe) < 0)
	{
		deProcess_setErrorFromErrno(process, "pipe() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	pid = fork();

	if (pid < 0)
	{
		deProcess_setErrorFromErrno(process, "fork() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	if (pid == 0)
	{
		/* Child process. */

		/* Close unused endpoints. */
		close(pipeIn[1]);
		close(pipeOut[0]);
		close(pipeErr[0]);
		close(statusPipe[0]);

		/* Set status pipe to close on exec(). That way parent will know that exec() succeeded. */
		if (fcntl(statusPipe[1], F_SETFD, FD_CLOEXEC) != 0)
			dieLastError(statusPipe[1], "Failed to set FD_CLOEXEC");

		/* Map stdin. */
		if (pipeIn[0] != STDIN_FILENO &&
			dup2(pipeIn[0], STDIN_FILENO) != STDIN_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeIn[0]);

		/* Stdout. */
		if (pipeOut[1] != STDOUT_FILENO &&
			dup2(pipeOut[1], STDOUT_FILENO) != STDOUT_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeOut[1]);

		/* Stderr. */
		if (pipeErr[1] != STDERR_FILENO &&
			dup2(pipeErr[1], STDERR_FILENO) != STDERR_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeErr[1]);

		/* Doesn't return. */
		execProcess(commandLine, workingDirectory, statusPipe[1]);
	}
	else
	{
		/* Parent process. */

		/* Check status. */
		{
			char	errBuf[256];
			ssize_t	result = 0;

			close(statusPipe[1]);
			while ((result = read(statusPipe[0], errBuf, 1)) == -1)
				if (errno != EAGAIN && errno != EINTR) break;

			if (result > 0)
			{
				int procStatus = 0;

				/* Read full error msg. */
				int errPos = 1;
				while (errPos < DE_LENGTH_OF_ARRAY(errBuf))
				{
					result = read(statusPipe[0], errBuf+errPos, 1);
					if (result == -1)
						break; /* Done. */

					errPos += 1;
				}

				/* Make sure str is null-terminated. */
				errBuf[errPos] = 0;

				/* Close handles. */
				close(statusPipe[0]);
				closePipe(pipeIn);
				closePipe(pipeOut);
				closePipe(pipeErr);

				/* Run waitpid to clean up zombie. */
				waitpid(pid, &procStatus, 0);

				deProcess_setError(process, errBuf);

				return DE_FALSE;
			}

			/* Status pipe is not needed. */
			close(statusPipe[0]);
		}

		/* Set running state. */
		process->pid		= pid;
		process->state		= PROCESSSTATE_RUNNING;

		/* Stdin, stdout. */
		close(pipeIn[0]);
		close(pipeOut[1]);
		close(pipeErr[1]);

		process->standardIn		= deFile_createFromHandle((deUintptr)pipeIn[1]);
		process->standardOut	= deFile_createFromHandle((deUintptr)pipeOut[0]);
		process->standardErr	= deFile_createFromHandle((deUintptr)pipeErr[0]);

		if (!process->standardIn)
			close(pipeIn[1]);

		if (!process->standardOut)
			close(pipeOut[0]);

		if (!process->standardErr)
			close(pipeErr[0]);
	}

	return DE_TRUE;
}